

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UInt32Math.h
# Opt level: O2

uint32 UInt32Math::AddMul<1u,2u>(uint32 left)

{
  if (left < 0x7fffffff) {
    return left * 2 + 2;
  }
  Math::DefaultOverflowPolicy();
}

Assistant:

static uint32 AddMul(uint32 left, __inout Func& overflowFn)
    {
        //
        // The result will overflow if (left+add)*mul > UINT_MAX
        // Rearranging, this becomes: left > (UINT_MAX / mul ) - add
        //
        // If mul and add are compile-time constants then LTCG will collapse
        // this to a simple constant comparison.
        //
        CompileAssert(UINT_MAX/mul >= add);

        if( left > ((UINT_MAX / mul) - add) )
        {
            overflowFn();
        }

        // When add and mul are small constants, the compiler is
        // typically able to use the LEA instruction here.
        return (left + add) * mul;
    }